

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int luaL_newmetatable(lua_State *L,char *tname)

{
  uint uVar1;
  TValue *pTVar2;
  size_t lenx;
  GCstr *key;
  TValue *pTVar3;
  GCtab *pGVar4;
  ulong uVar5;
  GCobj *o;
  GCtab *t;
  int iVar6;
  
  uVar1 = *(uint *)((ulong)(L->glref).ptr32 + 0x98);
  t = (GCtab *)(ulong)uVar1;
  lenx = strlen(tname);
  key = lj_str_new(L,tname,lenx);
  pTVar3 = lj_tab_setstr(L,t,key);
  if ((pTVar3->field_2).it == 0xffffffff) {
    iVar6 = 1;
    pGVar4 = lj_tab_new(L,0,1);
    (pTVar3->u32).lo = (uint32_t)pGVar4;
    (pTVar3->field_2).it = 0xfffffff4;
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    (pTVar3->u32).lo = (uint32_t)pGVar4;
    (pTVar3->field_2).it = 0xfffffff4;
    if ((t->marked & 4) != 0) {
      uVar5 = (ulong)(L->glref).ptr32;
      t->marked = t->marked & 0xfb;
      (t->gclist).gcptr32 = *(uint32_t *)(uVar5 + 0x3c);
      *(uint *)(uVar5 + 0x3c) = uVar1;
    }
  }
  else {
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pTVar3;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

LUALIB_API int luaL_newmetatable(lua_State *L, const char *tname)
{
  GCtab *regt = tabV(registry(L));
  TValue *tv = lj_tab_setstr(L, regt, lj_str_newz(L, tname));
  if (tvisnil(tv)) {
    GCtab *mt = lj_tab_new(L, 0, 1);
    settabV(L, tv, mt);
    settabV(L, L->top++, mt);
    lj_gc_anybarriert(L, regt);
    return 1;
  } else {
    copyTV(L, L->top++, tv);
    return 0;
  }
}